

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  InternalMetadata *pIVar5;
  long *plVar6;
  undefined1 *puVar7;
  long lVar8;
  size_type *psVar9;
  long lVar10;
  Result *_result;
  uint uVar11;
  string err;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,-1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,1,-1);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      if (layer->_oneof_case_[0] == 500) {
        puVar7 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar7 = Specification::_CustomLayerParams_default_instance_;
      }
      if (*(long *)(((ulong)((GRULayerParams *)puVar7)->updategatebiasvector_ & 0xfffffffffffffffe)
                   + 8) == 0) {
        std::operator+(&local_38,"Custom layer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_58.field_2._M_allocated_capacity = *psVar9;
          local_58.field_2._8_8_ = plVar6[3];
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar9;
          local_58._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_58._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
LAB_00347a71:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pIVar5 = &(((BatchnormLayerParams *)puVar7)->mean_->super_MessageLite)._internal_metadata_;
        if (((BatchnormLayerParams *)puVar7)->mean_ == (WeightParams *)0x0) {
          pIVar5 = (InternalMetadata *)0x0;
        }
        lVar8 = (long)*(int *)&(((ConvolutionLayerParams *)puVar7)->kernelsize_).arena_or_elements_;
        if (lVar8 != 0) {
          lVar10 = 0;
          do {
            lVar3 = *(long *)((long)&pIVar5->ptr_ + lVar10);
            bVar4 = 0 < *(int *)(lVar3 + 0x10);
            uVar11 = bVar4 + 1;
            if (*(long *)((*(ulong *)(lVar3 + 0x20) & 0xfffffffffffffffe) + 8) == 0) {
              uVar11 = (uint)bVar4;
            }
            if (((uVar11 - (*(long *)((*(ulong *)(lVar3 + 0x28) & 0xfffffffffffffffe) + 8) == 0)) +
                2) - (uint)(*(long *)((*(ulong *)(lVar3 + 0x30) & 0xfffffffffffffffe) + 8) == 0) !=
                1) {
              std::operator+(&local_38,"Custom layer ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              psVar9 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_58.field_2._M_allocated_capacity = *psVar9;
                local_58.field_2._8_8_ = plVar6[3];
              }
              else {
                local_58.field_2._M_allocated_capacity = *psVar9;
                local_58._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_58._M_string_length = plVar6[1];
              *plVar6 = (long)psVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_38._M_dataplus._M_p != &local_38.field_2) {
                operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
              goto LAB_00347a71;
            }
            lVar10 = lVar10 + 8;
          } while (lVar8 * 8 != lVar10);
        }
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, -1));

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}